

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecrt.cpp
# Opt level: O2

size_t CorUnix::InternalFwrite(void *pvBuffer,size_t nSize,size_t nCount,FILE *f,INT *pnErrorCode)

{
  size_t sVar1;
  
  if (f == (FILE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalFwrite",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/filecrt.cpp"
            ,0x21e);
    fprintf(_stderr,"Expression: f != NULL\n");
  }
  sVar1 = fwrite(pvBuffer,nSize,nCount,(FILE *)f);
  if (sVar1 < nCount) {
    *pnErrorCode = 1;
  }
  return sVar1;
}

Assistant:

size_t
CorUnix::InternalFwrite(
    const void *pvBuffer,
    size_t nSize,
    size_t nCount,
    FILE *f,
    INT *pnErrorCode
    )
{
    size_t nWrittenBytes = 0;
    _ASSERTE(f != NULL);

#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
    clearerr(f);
#endif

    nWrittenBytes = fwrite(pvBuffer, nSize, nCount, f);

    // Make sure no error occurred.
    if ( nWrittenBytes < nCount )
    {
        // Set the FILE* error code
        *pnErrorCode = PAL_FILE_ERROR;
    }

    return nWrittenBytes;
}